

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditPrivate::repaintContents(QTextEditPrivate *this,QRectF *contentsRect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QRectF *in_RSI;
  long in_FS_OFFSET;
  QRectF *this_00;
  QWidget *this_01;
  int yOffset;
  int xOffset;
  QRect r;
  QRectF visibleRect;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QTextEditPrivate *in_stack_ffffffffffffff70;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRectF::isValid(in_RSI);
  if (bVar1) {
    iVar2 = horizontalOffset(in_stack_ffffffffffffff70);
    iVar3 = verticalOffset((QTextEditPrivate *)0x6cfb7c);
    local_28.xp = -NAN;
    local_28.yp = -NAN;
    local_28.w = -NAN;
    local_28.h = -NAN;
    this_00 = (QRectF *)(double)iVar2;
    this_01 = (QWidget *)(double)iVar3;
    iVar2 = QWidget::width((QWidget *)0x6cfbe1);
    iVar3 = QWidget::height((QWidget *)0x6cfbfe);
    QRectF::QRectF(&local_28,(qreal)this_00,(qreal)this_01,(double)iVar2,(double)iVar3);
    QRectF::intersected(this_00,(QRectF *)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QRectF::toAlignedRect();
    bVar1 = QRect::isEmpty((QRect *)this_00);
    if (!bVar1) {
      QRect::translate((QRect *)this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      QWidget::update(this_01,(QRect *)this_00);
    }
  }
  else {
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    if (!contentsRect.isValid()) {
        viewport->update();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = verticalOffset();
    const QRectF visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
}